

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

absolute_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::LocalTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,int_fast64_t unix_time,
          TransitionType *tt)

{
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> cVar1;
  fields fVar2;
  
  cVar1.f_.m = '\x01';
  cVar1.f_.d = '\x01';
  cVar1.f_.hh = '\0';
  cVar1.f_.mm = '\0';
  cVar1.f_.ss = '\0';
  cVar1.f_._13_3_ = 0;
  cVar1.f_.y = 0x7b2;
  cVar1 = detail::operator+(cVar1,unix_time);
  fVar2 = (fields)detail::operator+(cVar1,(long)tt->utc_offset);
  (__return_storage_ptr__->cs).f_ = fVar2;
  __return_storage_ptr__->offset = tt->utc_offset;
  __return_storage_ptr__->is_dst = tt->is_dst;
  __return_storage_ptr__->abbr = (this->abbreviations_)._M_dataplus._M_p + tt->abbr_index;
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::LocalTime(
    std::int_fast64_t unix_time, const TransitionType& tt) const {
  // A civil time in "+offset" looks like (time+offset) in UTC.
  // Note: We perform two additions in the civil_second domain to
  // sidestep the chance of overflow in (unix_time + tt.utc_offset).
  return {(civil_second() + unix_time) + tt.utc_offset, tt.utc_offset,
          tt.is_dst, &abbreviations_[tt.abbr_index]};
}